

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O1

nh_bool get_gamedir(game_dirs dirtype,char *buf)

{
  nh_bool nVar1;
  __gid_t _Var2;
  __gid_t _Var3;
  __mode_t __mask;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  char *__format;
  char *pcVar7;
  char dirbuf [256];
  char acStack_128 [264];
  
  if (dirtype - SAVE_DIR < 3) {
    pcVar7 = &DAT_0011e3fc + *(int *)(&DAT_0011e3fc + (ulong)(dirtype - SAVE_DIR) * 4);
  }
  else {
    pcVar7 = "";
  }
  if (override_userdir == (char *)0x0) {
LAB_001156f5:
    pcVar5 = getenv("XDG_CONFIG_HOME");
    if (pcVar5 != (char *)0x0) {
      __format = "%s/DynaHack/%s";
      goto LAB_00115736;
    }
    pcVar5 = getenv("HOME");
    if (pcVar5 != (char *)0x0) {
      __format = "%s/.config/DynaHack/%s";
      goto LAB_00115736;
    }
LAB_001157b8:
    nVar1 = '\0';
  }
  else {
    _Var2 = getgid();
    _Var3 = getegid();
    if (_Var2 != _Var3) goto LAB_001156f5;
    __format = "%s/%s";
    pcVar5 = override_userdir;
LAB_00115736:
    snprintf(buf,0x100,__format,pcVar5,pcVar7);
    __mask = umask(0);
    iVar4 = mkdir(buf,0x1ed);
    if ((iVar4 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
      strcpy(acStack_128,buf);
      pcVar7 = dirname(acStack_128);
      mkdir(pcVar7,0x1ed);
      iVar4 = mkdir(buf,0x1ed);
      if (iVar4 == -1) {
        umask(__mask);
        goto LAB_001157b8;
      }
    }
    umask(__mask);
    nVar1 = '\x01';
  }
  return nVar1;
}

Assistant:

nh_bool get_gamedir(enum game_dirs dirtype, char *buf)
{
    char *envval, *subdir;
    mode_t mask;

    switch (dirtype) {
	case CONFIG_DIR: subdir = ""; break;
	case SAVE_DIR:   subdir = "save/"; break;
	case LOG_DIR:    subdir = "log/"; break;
	case DUMP_DIR:   subdir = "dumps/"; break;
    }

    if (override_userdir && getgid() == getegid()) {
	snprintf(buf, BUFSZ, "%s/%s", override_userdir, subdir);
    } else {
	/* look in regular location */
	envval = getenv("XDG_CONFIG_HOME");
	if (envval) {
	    snprintf(buf, BUFSZ, "%s/DynaHack/%s", envval, subdir);
	} else {
	    envval = getenv("HOME");
	    if (!envval) /* HOME not set? just give up... */
		return FALSE;
	    snprintf(buf, BUFSZ, "%s/.config/DynaHack/%s", envval, subdir);
	}
    }

    mask = umask(0);
    if (mkdir(buf, 0755) == -1 && errno != EEXIST) {
	/* try to create the parent directory too. This is the only problem we
	 * can fix here - permission problems etc. all requre user intervention */
	char dirbuf[BUFSZ], *basedir;
	strcpy(dirbuf, buf);
	basedir = dirname(dirbuf);
	
	mkdir(basedir, 0755); /* no need to check the return value: if it doesn't work, we're screwed */
	if (mkdir(buf, 0755) == -1) {
	    umask(mask);
	    return FALSE;
	}
    }
    umask(mask);

    return TRUE;
}